

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator.hpp
# Opt level: O0

int __thiscall
boost::unit_test::decorator::fixture_t::clone
          (fixture_t *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  fixture_t *p;
  shared_ptr<boost::unit_test::test_unit_fixture> *in_stack_ffffffffffffff98;
  int iVar1;
  fixture_t *impl;
  fixture_t *this_00;
  
  impl = this;
  p = (fixture_t *)operator_new(0x18);
  this_00 = p;
  shared_ptr<boost::unit_test::test_unit_fixture>::shared_ptr
            ((shared_ptr<boost::unit_test::test_unit_fixture> *)this,in_stack_ffffffffffffff98);
  fixture_t((fixture_t *)__fn,(test_unit_fixture_ptr *)impl);
  iVar1 = (int)impl;
  shared_ptr<boost::unit_test::decorator::base>::shared_ptr<boost::unit_test::decorator::fixture_t>
            ((shared_ptr<boost::unit_test::decorator::base> *)this_00,p);
  shared_ptr<boost::unit_test::test_unit_fixture>::~shared_ptr
            ((shared_ptr<boost::unit_test::test_unit_fixture> *)0x2483d7);
  return iVar1;
}

Assistant:

virtual base_ptr        clone() const { return base_ptr(new fixture_t( m_impl )); }